

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O1

void test_iterate(void)

{
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  bitset_t *bitset;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar9 = 0;
  bitset = bitset_create();
  do {
    uVar10 = uVar9 >> 6;
    if (uVar10 < bitset->arraysize) {
LAB_00102b7e:
      bitset->array[uVar10] = bitset->array[uVar10] | 1L << ((byte)uVar9 & 0x3f);
    }
    else {
      _Var3 = bitset_grow(bitset,uVar10 + 1);
      if (_Var3) goto LAB_00102b7e;
    }
    uVar9 = uVar9 + 3;
    if (uVar9 == 3000) {
      sVar5 = bitset_count(bitset);
      _assert_true((ulong)(sVar5 == 1000),"bitset_count(b) == 1000",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x14);
      iVar4 = compute_cardinality(bitset);
      _assert_true((ulong)(iVar4 == 1000),"compute_cardinality(b) == 1000",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x15);
      uVar10 = 0;
      uVar9 = 0;
      do {
        uVar6 = uVar10 >> 6;
        if (uVar6 < bitset->arraysize) {
          uVar8 = bitset->array[uVar6] >> ((byte)uVar10 & 0x3f);
          if (uVar8 == 0) {
            lVar7 = uVar6 * -0x40;
            do {
              uVar6 = uVar6 + 1;
              if (bitset->arraysize == uVar6) goto LAB_00102c58;
              uVar8 = bitset->array[uVar6];
              lVar7 = lVar7 + -0x40;
            } while (uVar8 == 0);
            lVar1 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
              }
            }
            uVar10 = lVar1 - lVar7;
          }
          else {
            lVar7 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar10 = uVar10 + lVar7;
          }
          bVar2 = true;
        }
        else {
LAB_00102c58:
          bVar2 = false;
        }
        if (!bVar2) {
          _assert_true((ulong)(uVar9 == 3000),"k == 3000",
                       "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                       ,0x1b);
          bitset_free(bitset);
          return;
        }
        _assert_true((ulong)(uVar10 == uVar9),"i == k",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                     ,0x18);
        uVar9 = uVar9 + 3;
        uVar10 = uVar10 + 1;
      } while( true );
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_iterate) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(bitset_count(b) == 1000);
    assert_true(compute_cardinality(b) == 1000);
    size_t k = 0;
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        assert_true(i == k);
        k += 3;
    }
    assert_true(k == 3000);
    bitset_free(b);
}